

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O3

void __thiscall iDynTree::AttitudeQuaternionEKF::AttitudeQuaternionEKF(AttitudeQuaternionEKF *this)

{
  Matrix4x4 *pMVar1;
  long lVar2;
  AttitudeEstimatorState *pAVar3;
  AttitudeEstimatorState *pAVar4;
  byte bVar5;
  double local_48;
  double dStack_40;
  double local_38;
  
  bVar5 = 0;
  (this->super_IAttitudeEstimator)._vptr_IAttitudeEstimator =
       (_func_int **)&PTR__IAttitudeEstimator_00180ad0;
  DiscreteExtendedKalmanFilterHelper::DiscreteExtendedKalmanFilterHelper
            (&this->super_DiscreteExtendedKalmanFilterHelper);
  (this->super_IAttitudeEstimator)._vptr_IAttitudeEstimator =
       (_func_int **)&PTR__AttitudeQuaternionEKF_00180be8;
  (this->super_DiscreteExtendedKalmanFilterHelper)._vptr_DiscreteExtendedKalmanFilterHelper =
       (_func_int **)&PTR_ekf_f_00180c88;
  (this->m_params_qekf).time_step_in_seconds = 0.01;
  (this->m_params_qekf).bias_correlation_time_factor = 0.01;
  (this->m_params_qekf).accelerometer_noise_variance = 0.001;
  (this->m_params_qekf).magnetometer_noise_variance = 0.001;
  (this->m_params_qekf).gyroscope_noise_variance = 0.001;
  (this->m_params_qekf).gyro_bias_noise_variance = 0.0001;
  (this->m_params_qekf).initial_orientation_error_variance = 10.0;
  (this->m_params_qekf).initial_ang_vel_error_variance = 10.0;
  (this->m_params_qekf).initial_gyro_bias_error_variance = 10.0;
  (this->m_params_qekf).use_magnetometer_measurements = false;
  iDynTree::Rotation::Rotation(&this->m_orientationInSO3);
  iDynTree::VectorDynSize::VectorDynSize(&this->m_x);
  iDynTree::VectorDynSize::VectorDynSize(&this->m_y);
  iDynTree::VectorDynSize::VectorDynSize(&this->m_u);
  this->m_initialized = false;
  (this->m_state_qekf).m_orientation.m_data[1] = 0.0;
  (this->m_state_qekf).m_orientation.m_data[2] = 0.0;
  (this->m_state_qekf).m_orientation.m_data[3] = 0.0;
  (this->m_state_qekf).m_orientation.m_data[0] = 1.0;
  (this->m_state_qekf).m_angular_velocity.m_data[0] = 0.0;
  (this->m_state_qekf).m_angular_velocity.m_data[1] = 0.0;
  (this->m_state_qekf).m_angular_velocity.m_data[2] = 0.0;
  (this->m_state_qekf).m_gyroscope_bias.m_data[0] = 0.0;
  (this->m_state_qekf).m_gyroscope_bias.m_data[1] = 0.0;
  (this->m_state_qekf).m_gyroscope_bias.m_data[2] = 0.0;
  pAVar3 = &this->m_state_qekf;
  pAVar4 = &this->m_initial_state_qekf;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pAVar4->m_orientation).m_data[0] = (pAVar3->m_orientation).m_data[0];
    pAVar3 = (AttitudeEstimatorState *)((long)pAVar3 + (ulong)bVar5 * -0x10 + 8);
    pAVar4 = (AttitudeEstimatorState *)((long)pAVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  iDynTree::Rotation::fromQuaternion((VectorFixSize *)&this->m_orientationInSO3);
  iDynTree::Rotation::asRPY();
  pMVar1 = &this->m_Id4;
  (this->m_orientationInRPY).m_data[2] = local_38;
  (this->m_orientationInRPY).m_data[0] = local_48;
  (this->m_orientationInRPY).m_data[1] = dStack_40;
  (this->m_Omega_y).m_data[2] = 0.0;
  (this->m_Acc_y).m_data[0] = 0.0;
  (this->m_Omega_y).m_data[0] = 0.0;
  (this->m_Omega_y).m_data[1] = 0.0;
  (this->m_Acc_y).m_data[1] = 0.0;
  (this->m_Acc_y).m_data[2] = 1.0;
  (this->m_gravity_direction).super_Vector3.m_data[0] = 0.0;
  (this->m_gravity_direction).super_Vector3.m_data[1] = 0.0;
  (this->m_gravity_direction).super_Vector3.m_data[2] = 1.0;
  (this->m_Id4).m_data[0xe] = 0.0;
  (this->m_Id4).m_data[0xf] = 0.0;
  (this->m_Id4).m_data[0xc] = 0.0;
  (this->m_Id4).m_data[0xd] = 0.0;
  (this->m_Id4).m_data[10] = 0.0;
  (this->m_Id4).m_data[0xb] = 0.0;
  (this->m_Id4).m_data[8] = 0.0;
  (this->m_Id4).m_data[9] = 0.0;
  (this->m_Id4).m_data[6] = 0.0;
  (this->m_Id4).m_data[7] = 0.0;
  (this->m_Id4).m_data[4] = 0.0;
  (this->m_Id4).m_data[5] = 0.0;
  (this->m_Id4).m_data[2] = 0.0;
  (this->m_Id4).m_data[3] = 0.0;
  pMVar1->m_data[0] = 0.0;
  (this->m_Id4).m_data[1] = 0.0;
  lVar2 = 0;
  do {
    pMVar1->m_data[0] = 1.0;
    lVar2 = lVar2 + 8;
    pMVar1 = (Matrix4x4 *)(pMVar1->m_data + 5);
  } while (lVar2 != 0x20);
  (this->m_Id3).m_data[0] = 1.0;
  (this->m_Id3).m_data[1] = 0.0;
  (this->m_Id3).m_data[2] = 0.0;
  (this->m_Id3).m_data[3] = 0.0;
  (this->m_Id3).m_data[4] = 1.0;
  (this->m_Id3).m_data[5] = 0.0;
  (this->m_Id3).m_data[6] = 0.0;
  (this->m_Id3).m_data[7] = 0.0;
  (this->m_Id3).m_data[8] = 1.0;
  return;
}

Assistant:

iDynTree::AttitudeQuaternionEKF::AttitudeQuaternionEKF()
{
    m_state_qekf.m_orientation.zero();
    m_state_qekf.m_orientation(0) = 1.0;
    m_state_qekf.m_angular_velocity.zero();
    m_state_qekf.m_gyroscope_bias.zero();

    m_initial_state_qekf = m_state_qekf;
    m_orientationInSO3.fromQuaternion(m_state_qekf.m_orientation);
    m_orientationInRPY = m_orientationInSO3.asRPY();

    m_Omega_y.zero();
    m_Acc_y.zero();
    m_Acc_y(2) = 1; // TODO: validate this assumption at initial step

    m_gravity_direction.zero();
    m_gravity_direction(2) = 1;

    using iDynTree::toEigen;
    toEigen(m_Id4).setIdentity();
    toEigen(m_Id3).setIdentity();
}